

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O3

void __thiscall CorUnix::CPalThread::~CPalThread(CPalThread *this)

{
  int iVar1;
  
  this->_vptr_CPalThread = (_func_int **)&PTR__CPalThread_001879a8;
  if (this->m_fLockInitialized == true) {
    InternalDeleteCriticalSection(&this->m_csLock);
  }
  if (this->m_fStartItemsInitialized == true) {
    iVar1 = pthread_cond_destroy((pthread_cond_t *)&this->m_startCond);
    if (iVar1 == 0) {
      iVar1 = pthread_mutex_destroy((pthread_mutex_t *)&this->m_startMutex);
      if (iVar1 == 0) goto LAB_00143964;
      fprintf(_stderr,"ASSERTION (%s, line %d) %s %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
              ,0x80b,"0 == iError","");
      fflush(_stderr);
    }
    else {
      fprintf(_stderr,"ASSERTION (%s, line %d) %s %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
              ,0x808,"0 == iError","");
      fflush(_stderr);
    }
    abort();
  }
LAB_00143964:
  CThreadSuspensionInfo::~CThreadSuspensionInfo(&this->suspensionInfo);
  CThreadSynchronizationInfo::~CThreadSynchronizationInfo(&this->synchronizationInfo);
  return;
}

Assistant:

CPalThread::~CPalThread()
{
    // @UNIXTODO: This is our last chance to unlink our Mach exception handler from the pseudo-chain we're trying
    // to maintain. Unfortunately we don't have enough data or control to do this at all well (and we can't
    // guarantee that another component hasn't chained to us, about which we can do nothing). If the kernel or
    // another component forwards an exception notification to us for this thread things will go badly (we'll
    // terminate the process when trying to look up this CPalThread in order to find forwarding information).
    // On the flip side I don't believe we'll get here currently unless the thread has been terminated (in
    // which case it's not an issue). If we start supporting unload or early disposal of CPalThread objects
    // (say when we return from an outer reverse p/invoke) then we'll need to revisit this. But hopefully by
    // then we'll have an alternative design for handling hardware exceptions.

    if (m_fLockInitialized)
    {
        InternalDeleteCriticalSection(&m_csLock);
    }

    if (m_fStartItemsInitialized)
    {
        int iError;

        iError = pthread_cond_destroy(&m_startCond);
        _ASSERTE(0 == iError);

        iError = pthread_mutex_destroy(&m_startMutex);
        _ASSERTE(0 == iError);
    }
}